

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb::BitpackingCompressionState<long,_true,_long>::BitpackingWriter::WriteFor
               (long *values,bool *validity,bitpacking_width_t width,long frame_of_reference,
               idx_t count,void *data_ptr)

{
  int iVar1;
  int iVar2;
  long lVar3;
  unsigned_long uVar4;
  long *plVar5;
  idx_t iVar6;
  ulong uVar7;
  bitpacking_metadata_encoded_t encoded_value;
  ulong uVar8;
  ulong uVar9;
  uint64_t *in;
  ulong uVar10;
  ulong uVar11;
  uint64_t local_138 [33];
  
  iVar6 = count;
  if ((count & 0x1f) != 0) {
    uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)count & 0x1f);
    iVar6 = (count - uVar4) + 0x20;
  }
  uVar10 = (ulong)width;
  uVar7 = iVar6 * uVar10 >> 3;
  FlushAndCreateSegmentIfFull
            ((BitpackingCompressionState<long,_true,_long> *)data_ptr,uVar7 + 0x10,4);
  iVar1 = *(int *)((long)data_ptr + 0x40);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)((long)data_ptr + 0x38));
  lVar3 = *(long *)((long)data_ptr + 0x48);
  iVar2 = *(int *)(*(long *)((long)data_ptr + 0x38) + 0x10);
  *(long *)((long)data_ptr + 0x48) = lVar3 + -4;
  *(uint *)(lVar3 + -4) = iVar1 - iVar2 | 0x5000000;
  plVar5 = *(long **)((long)data_ptr + 0x40);
  *plVar5 = frame_of_reference;
  plVar5[1] = uVar10;
  plVar5 = plVar5 + 2;
  *(long **)((long)data_ptr + 0x40) = plVar5;
  uVar11 = count & 0xffffffffffffffe0;
  if (uVar11 != 0) {
    uVar9 = 0;
    uVar8 = 0;
    in = (uint64_t *)values;
    do {
      duckdb_fastpforlib::fastpack(in,(uint32_t *)((uVar9 >> 3) + (long)plVar5),(uint)width);
      uVar8 = uVar8 + 0x20;
      in = in + 0x20;
      uVar9 = uVar9 + (ulong)width * 0x20;
    } while (uVar8 < uVar11);
  }
  if ((count & 0x1f) != 0) {
    uVar8 = (ulong)(((uint)count & 0x1f) << 3);
    switchD_012e5a64::default((void *)((long)local_138 + uVar8),0,0x100 - uVar8);
    switchD_012bc561::default(local_138,values + uVar11,uVar8);
    duckdb_fastpforlib::fastpack
              (local_138,(uint32_t *)((long)plVar5 + (uVar10 * uVar11 >> 3)),(uint)width);
  }
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + uVar7;
  UpdateStats((BitpackingCompressionState<long,_true,_long> *)data_ptr,count);
  return;
}

Assistant:

static void WriteFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference, idx_t count,
		                     void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 2 * sizeof(T));

			WriteMetaData(state, BitpackingMode::FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, (T)width);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}